

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iexchange.hpp
# Opt level: O2

void __thiscall
diy::Master::IExchangeInfo::IExchangeInfo(IExchangeInfo *this,communicator *c,Profiler *p)

{
  int iVar1;
  
  this->_vptr_IExchangeInfo = (_func_int **)&PTR__IExchangeInfo_0013ec38;
  (this->comm).comm_.data = (c->comm_).data;
  iVar1 = c->size_;
  (this->comm).rank_ = c->rank_;
  (this->comm).size_ = iVar1;
  (this->comm).owner_ = false;
  std::make_shared<diy::spd::logger>();
  this->prof = p;
  return;
}

Assistant:

IExchangeInfo(mpi::communicator c, stats::Profiler& p):
                            comm(c),
                            prof(p)                             {}